

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::CompareDistances(S2Point *x,S2Point *a,S2Point *b)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *ap;
  long lVar6;
  double dVar7;
  double local_c0;
  Vector3_xf local_b8;
  Vector3_xf local_88;
  Vector3_xf local_58;
  
  iVar5 = TriageCompareCosDistances<double>(x,a,b);
  if (iVar5 == 0) {
    dVar2 = a->c_[0];
    dVar3 = b->c_[0];
    if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
      lVar6 = 0;
      do {
        if (lVar6 == 0x10) {
          return 0;
        }
        dVar4 = *(double *)((long)a->c_ + lVar6 + 8);
        pdVar1 = (double *)((long)b->c_ + lVar6 + 8);
        lVar6 = lVar6 + 8;
      } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
    }
    dVar4 = x->c_[0];
    dVar7 = a->c_[2] * x->c_[2] + a->c_[1] * x->c_[1] + dVar2 * dVar4 + 0.0;
    if (dVar7 <= 0.7071067811865476) {
      if (-0.7071067811865476 <= dVar7) {
        local_58.c_[0]._0_10_ = (BADTYPE)dVar4;
        local_58.c_[1]._0_10_ = (BADTYPE)x->c_[1];
        local_58.c_[2]._0_10_ = (BADTYPE)x->c_[2];
        local_88.c_[0]._0_10_ = (BADTYPE)dVar2;
        local_88.c_[1]._0_10_ = (BADTYPE)a->c_[1];
        local_88.c_[2]._0_10_ = (BADTYPE)a->c_[2];
        local_b8.c_[0]._0_10_ = (BADTYPE)dVar3;
        local_b8.c_[1]._0_10_ = (BADTYPE)b->c_[1];
        local_b8.c_[2]._0_10_ = (BADTYPE)b->c_[2];
        local_c0 = dVar4;
        iVar5 = TriageCompareCosDistances<long_double>
                          ((Vector3<long_double> *)&local_58,(Vector3<long_double> *)&local_88,
                           (Vector3<long_double> *)&local_b8);
      }
      else {
        iVar5 = CompareSin2Distances(x,a,b);
        iVar5 = -iVar5;
      }
    }
    else {
      iVar5 = CompareSin2Distances(x,a,b);
    }
    if (iVar5 == 0) {
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (&local_58,(BasicVector<Vector3,ExactFloat,3ul> *)x);
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (&local_88,(BasicVector<Vector3,ExactFloat,3ul> *)a);
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (&local_b8,(BasicVector<Vector3,ExactFloat,3ul> *)b);
      iVar5 = ExactCompareDistances(&local_58,&local_88,&local_b8);
      lVar6 = 0x30;
      do {
        BN_free(*(BIGNUM **)((long)local_b8.c_ + lVar6 + -8));
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
      lVar6 = 0x30;
      do {
        BN_free(*(BIGNUM **)((long)&local_b8.c_[2].bn_.bn_ + lVar6));
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
      lVar6 = 0x30;
      do {
        BN_free(*(BIGNUM **)((long)&local_88.c_[2].bn_.bn_ + lVar6));
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
      if (iVar5 == 0) {
        lVar6 = 0;
        do {
          dVar2 = *(double *)((long)a->c_ + lVar6);
          dVar3 = *(double *)((long)b->c_ + lVar6);
          if (dVar2 != dVar3) {
            if (dVar2 < dVar3) {
              return 1;
            }
            break;
          }
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x18);
        lVar6 = 0;
        do {
          dVar2 = *(double *)((long)b->c_ + lVar6);
          dVar3 = *(double *)((long)a->c_ + lVar6);
          if (dVar2 != dVar3) {
            return -(uint)(dVar2 < dVar3);
          }
          lVar6 = lVar6 + 8;
          iVar5 = 0;
        } while (lVar6 != 0x18);
      }
    }
  }
  return iVar5;
}

Assistant:

int CompareDistances(const S2Point& x, const S2Point& a, const S2Point& b) {
  // We start by comparing distances using dot products (i.e., cosine of the
  // angle), because (1) this is the cheapest technique, and (2) it is valid
  // over the entire range of possible angles.  (We can only use the sin^2
  // technique if both angles are less than 90 degrees or both angles are
  // greater than 90 degrees.)
  int sign = TriageCompareCosDistances(x, a, b);
  if (sign != 0) return sign;

  // Optimization for (a == b) to avoid falling back to exact arithmetic.
  if (a == b) return 0;

  // It is much better numerically to compare distances using cos(angle) if
  // the distances are near 90 degrees and sin^2(angle) if the distances are
  // near 0 or 180 degrees.  We only need to check one of the two angles when
  // making this decision because the fact that the test above failed means
  // that angles "a" and "b" are very close together.
  double cos_ax = a.DotProd(x);
  if (cos_ax > M_SQRT1_2) {
    // Angles < 45 degrees.
    sign = CompareSin2Distances(x, a, b);
  } else if (cos_ax < -M_SQRT1_2) {
    // Angles > 135 degrees.  sin^2(angle) is decreasing in this range.
    sign = -CompareSin2Distances(x, a, b);
  } else {
    // We've already tried double precision, so continue with "long double".
    sign = TriageCompareCosDistances(ToLD(x), ToLD(a), ToLD(b));
  }
  if (sign != 0) return sign;
  sign = ExactCompareDistances(ToExact(x), ToExact(a), ToExact(b));
  if (sign != 0) return sign;
  return SymbolicCompareDistances(x, a, b);
}